

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O0

void __thiscall String::detach(String *this,usize copyLength,usize minCapacity)

{
  char *pcVar1;
  Data *pDVar2;
  uint64 uVar3;
  EVP_PKEY_CTX *local_50;
  Data *newData;
  usize capacity;
  usize minCapacity_local;
  usize copyLength_local;
  String *this_local;
  
  if ((this->data->ref == 1) && (minCapacity <= this->data->capacity)) {
    pcVar1 = this->data->str;
    this->data->len = copyLength;
    pcVar1[copyLength] = '\0';
  }
  else {
    pDVar2 = (Data *)operator_new__((minCapacity | 3) + 0x21);
    pDVar2->str = (char *)(pDVar2 + 1);
    if (this->data->len == 0) {
      *pDVar2->str = '\0';
      pDVar2->len = copyLength;
    }
    else {
      local_50 = (EVP_PKEY_CTX *)copyLength;
      if (this->data->len < copyLength) {
        local_50 = (EVP_PKEY_CTX *)this->data->len;
      }
      Memory::copy((Memory *)pDVar2->str,(EVP_PKEY_CTX *)this->data->str,local_50);
      pDVar2->len = copyLength;
      pDVar2->str[copyLength] = '\0';
    }
    pDVar2->ref = 1;
    pDVar2->capacity = minCapacity | 3;
    if (((this->data->ref != 0) && (uVar3 = Atomic::decrement(&this->data->ref), uVar3 == 0)) &&
       (this->data != (Data *)0x0)) {
      operator_delete__(this->data);
    }
    this->data = pDVar2;
  }
  return;
}

Assistant:

void detach(usize copyLength, usize minCapacity)
  {
#ifdef ASSERT
    ASSERT(copyLength <= minCapacity);
#endif
    if(data->ref == 1 && minCapacity <= data->capacity)
    {
      ((char*)data->str)[data->len = copyLength] = '\0';
      return;
    }

    usize capacity = minCapacity | 0x3;
    Data* newData = (Data*)new char[(capacity + 1) * sizeof(char) + sizeof(Data)];
    newData->str = (char*)((byte*)newData + sizeof(Data));
    if(data->len > 0)
    {
      Memory::copy((char*)newData->str, data->str, (data->len < copyLength ? data->len : copyLength) * sizeof(char));
      ((char*)newData->str)[newData->len = copyLength] = '\0';
    }
    else
    {
      *(char*)newData->str = '\0';
      newData->len = copyLength;
    }
    newData->ref = 1;
    newData->capacity = capacity;

    if(data->ref && Atomic::decrement(data->ref) == 0)
      delete[] (char*)data;

    data = newData;
  }